

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void ITransformOne(uint8_t *ref,int16_t *in,uint8_t *dst)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint8_t uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  short *in_RSI;
  long in_RDI;
  int d_1;
  int c_1;
  int b_1;
  int a_1;
  int dc;
  int d;
  int c;
  int b;
  int a;
  int i;
  int *tmp;
  int C [16];
  int local_64;
  int *local_60;
  int local_58 [16];
  long local_18;
  short *local_10;
  long local_8;
  
  local_18 = CONCAT71(in_register_00000011,in_DL);
  local_60 = local_58;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    sVar1 = *local_10;
    sVar2 = local_10[8];
    sVar3 = *local_10;
    sVar4 = local_10[8];
    iVar6 = (local_10[4] * 0x8a8c >> 0x10) - (local_10[0xc] * 0x14e7b >> 0x10);
    iVar7 = (local_10[4] * 0x14e7b >> 0x10) + (local_10[0xc] * 0x8a8c >> 0x10);
    *local_60 = (int)sVar1 + (int)sVar2 + iVar7;
    local_60[1] = ((int)sVar3 - (int)sVar4) + iVar6;
    local_60[2] = ((int)sVar3 - (int)sVar4) - iVar6;
    local_60[3] = ((int)sVar1 + (int)sVar2) - iVar7;
    local_60 = local_60 + 4;
    local_10 = local_10 + 1;
  }
  local_60 = local_58;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    iVar6 = *local_60 + 4 + local_60[8];
    iVar7 = (*local_60 + 4) - local_60[8];
    iVar8 = (local_60[4] * 0x8a8c >> 0x10) - (local_60[0xc] * 0x14e7b >> 0x10);
    iVar9 = (local_60[4] * 0x14e7b >> 0x10) + (local_60[0xc] * 0x8a8c >> 0x10);
    uVar5 = clip_8b((uint)*(byte *)(local_8 + (local_64 << 5)) + (iVar6 + iVar9 >> 3));
    *(uint8_t *)(local_18 + (local_64 << 5)) = uVar5;
    uVar5 = clip_8b((uint)*(byte *)(local_8 + (local_64 * 0x20 + 1)) + (iVar7 + iVar8 >> 3));
    *(uint8_t *)(local_18 + (local_64 * 0x20 + 1)) = uVar5;
    uVar5 = clip_8b((uint)*(byte *)(local_8 + (local_64 * 0x20 + 2)) + (iVar7 - iVar8 >> 3));
    *(uint8_t *)(local_18 + (local_64 * 0x20 + 2)) = uVar5;
    uVar5 = clip_8b((uint)*(byte *)(local_8 + (local_64 * 0x20 + 3)) + (iVar6 - iVar9 >> 3));
    *(uint8_t *)(local_18 + (local_64 * 0x20 + 3)) = uVar5;
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

static WEBP_INLINE void ITransformOne(const uint8_t* ref, const int16_t* in,
                                      uint8_t* dst) {
  int C[4 * 4], *tmp;
  int i;
  tmp = C;
  for (i = 0; i < 4; ++i) {    // vertical pass
    const int a = in[0] + in[8];
    const int b = in[0] - in[8];
    const int c = MUL(in[4], kC2) - MUL(in[12], kC1);
    const int d = MUL(in[4], kC1) + MUL(in[12], kC2);
    tmp[0] = a + d;
    tmp[1] = b + c;
    tmp[2] = b - c;
    tmp[3] = a - d;
    tmp += 4;
    in++;
  }

  tmp = C;
  for (i = 0; i < 4; ++i) {    // horizontal pass
    const int dc = tmp[0] + 4;
    const int a =  dc +  tmp[8];
    const int b =  dc -  tmp[8];
    const int c = MUL(tmp[4], kC2) - MUL(tmp[12], kC1);
    const int d = MUL(tmp[4], kC1) + MUL(tmp[12], kC2);
    STORE(0, i, a + d);
    STORE(1, i, b + c);
    STORE(2, i, b - c);
    STORE(3, i, a - d);
    tmp++;
  }
}